

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Group * __thiscall SceneParser::parseGroup(SceneParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Group *this_00;
  Material *pMVar4;
  Vector3f *v0;
  Object3D *local_a8;
  Object3D *object;
  int index;
  bool in_light;
  int count;
  Group *local_88;
  Group *answer;
  char local_78 [4];
  int num_objects;
  char token [100];
  SceneParser *this_local;
  
  unique0x10000541 = this;
  getToken(this,local_78);
  iVar2 = strcmp(local_78,"{");
  if (iVar2 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x117,"Group *SceneParser::parseGroup()");
  }
  getToken(this,local_78);
  iVar2 = strcmp(local_78,"numObjects");
  if (iVar2 == 0) {
    answer._4_4_ = readInt(this);
    this_00 = (Group *)operator_new(0x48);
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&(this_00->super_Object3D).field_0x20 = 0;
    (this_00->super_Object3D).material = (Material *)0x0;
    *(undefined8 *)&(this_00->super_Object3D).field_0x10 = 0;
    *(undefined8 *)&(this_00->super_Object3D).field_0x18 = 0;
    (this_00->super_Object3D)._vptr_Object3D = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_Object3D).type = 0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Group::Group(this_00);
    index = 0;
    object._7_1_ = 0;
    local_88 = this_00;
    while( true ) {
      while( true ) {
        if (answer._4_4_ <= index) {
          getToken(this,local_78);
          iVar2 = strcmp(local_78,"}");
          if (iVar2 == 0) {
            return local_88;
          }
          __assert_fail("!strcmp(token, \"}\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                        ,0x137,"Group *SceneParser::parseGroup()");
        }
        getToken(this,local_78);
        iVar2 = strcmp(local_78,"MaterialIndex");
        if (iVar2 == 0) break;
        local_a8 = parseObject(this,local_78);
        if (local_a8 == (Object3D *)0x0) {
          __assert_fail("object != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                        ,0x12d,"Group *SceneParser::parseGroup()");
        }
        Group::addObject(local_88,local_a8);
        index = index + 1;
        std::vector<Object3D_*,_std::allocator<Object3D_*>_>::push_back(&this->_objects,&local_a8);
        if ((object._7_1_ & 1) != 0) {
          std::vector<Object3D_*,_std::allocator<Object3D_*>_>::push_back(&this->lights,&local_a8);
        }
      }
      iVar2 = readInt(this);
      bVar1 = false;
      object._0_4_ = iVar2;
      if (-1 < iVar2) {
        iVar3 = getNumMaterials(this);
        bVar1 = iVar2 <= iVar3;
      }
      if (!bVar1) break;
      pMVar4 = getMaterial(this,(int)object);
      this->_current_material = pMVar4;
      v0 = Material::getLight(this->_current_material);
      object._7_1_ = operator!=(v0,&Vector3f::ZERO);
    }
    __assert_fail("index >= 0 && index <= getNumMaterials()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x128,"Group *SceneParser::parseGroup()");
  }
  __assert_fail("!strcmp(token, \"numObjects\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x11b,"Group *SceneParser::parseGroup()");
}

Assistant:

Group *
SceneParser::parseGroup() {
    // Each group starts with an integer that specifies
    // the number of objects in the group.
    //
    // The material index sets the material of all objects which follow,
    // until the next material index (scoping for the materials is very
    // simple, and essentially ignores any tree hierarchy).
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numObjects"));
    int num_objects = readInt();

    Group *answer = new Group();

    // Read in the objects.
    int count = 0;
    bool in_light = false;
    while (num_objects > count) {
        getToken(token);
        if (!strcmp(token, "MaterialIndex")) {
            // Change the current material.
            int index = readInt();
            assert(index >= 0 && index <= getNumMaterials());
            _current_material = getMaterial(index);
            in_light = _current_material->getLight() != Vector3f::ZERO;
        } else {
            Object3D *object = parseObject(token);
            assert(object != NULL);
            answer->addObject(object);
            count++;
            _objects.push_back(object);
            if (in_light) {
                lights.push_back(object);
            }
        }
    }
    getToken(token);
    assert(!strcmp(token, "}"));

    // Return the group.
    return answer;
}